

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::CommentInfo::setComment(CommentInfo *this,char *text)

{
  size_t sVar1;
  char *__dest;
  runtime_error *this_00;
  uint uVar2;
  
  if (this->comment_ != (char *)0x0) {
    free(this->comment_);
  }
  if (text == (char *)0x0) {
    __assert_fail("text != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x93,"void Json::Value::CommentInfo::setComment(const char *)");
  }
  if ((*text == '\0') || (*text == '/')) {
    sVar1 = strlen(text);
    uVar2 = 0x7ffffffe;
    if ((uint)sVar1 < 0x7ffffffe) {
      uVar2 = (uint)sVar1;
    }
    __dest = (char *)malloc((ulong)(uVar2 + 1));
    if (__dest != (char *)0x0) {
      memcpy(__dest,text,(ulong)uVar2);
      __dest[uVar2] = '\0';
      this->comment_ = __dest;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::setComment(): Comments must start with /");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Value::CommentInfo::setComment(const char* text) {
  if (comment_)
    releaseStringValue(comment_);
  JSON_ASSERT(text != 0);
  JSON_ASSERT_MESSAGE(
      text[0] == '\0' || text[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  // It seems that /**/ style comments are acceptable as well.
  comment_ = duplicateStringValue(text);
}